

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O2

void crn_set_memory_callbacks(crn_realloc_func pRealloc,crn_msize_func pMSize,void *pUser_data)

{
  code *pcVar1;
  code *pcVar2;
  
  pcVar2 = crnlib::crnlib_default_realloc;
  if (pRealloc != (crn_realloc_func)0x0 && pMSize != (crn_msize_func)0x0) {
    pcVar2 = pRealloc;
  }
  pcVar1 = crnlib::crnlib_default_msize;
  crnlib::g_pUser_data = (void *)0x0;
  if (pRealloc != (crn_realloc_func)0x0 && pMSize != (crn_msize_func)0x0) {
    crnlib::g_pUser_data = pUser_data;
    pcVar1 = pMSize;
  }
  crnlib::g_pRealloc = pcVar2;
  crnlib::g_pMSize = pcVar1;
  return;
}

Assistant:

void crn_set_memory_callbacks(crn_realloc_func pRealloc, crn_msize_func pMSize, void* pUser_data)
{
    if ((!pRealloc) || (!pMSize))
    {
        crnlib::g_pRealloc = crnlib::crnlib_default_realloc;
        crnlib::g_pMSize = crnlib::crnlib_default_msize;
        crnlib::g_pUser_data = nullptr;
    }
    else
    {
        crnlib::g_pRealloc = pRealloc;
        crnlib::g_pMSize = pMSize;
        crnlib::g_pUser_data = pUser_data;
    }
}